

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AutoReg::AutoReg
          (AutoReg *this,ITestInvoker *invoker,SourceLineInfo *lineInfo,StringRef *classOrMethod,
          NameAndTags *nameAndTags)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  StringRef *classOrQualifiedMethodName;
  IMutableRegistryHub *pIVar2;
  string local_100;
  TestCase local_e0;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__AutoReg_001947b0;
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  extractClassName_abi_cxx11_(&local_100,(Catch *)classOrMethod,classOrQualifiedMethodName);
  makeTestCase(&local_e0,invoker,&local_100,nameAndTags,lineInfo);
  pIVar2 = &(pSVar1->super_RegistryHub).super_IMutableRegistryHub;
  (*pIVar2->_vptr_IMutableRegistryHub[4])(pIVar2,&local_e0);
  if (local_e0.test.super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.test.super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.super_TestCaseInfo.lcaseTags);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.super_TestCaseInfo.tags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.super_TestCaseInfo.description._M_dataplus._M_p !=
      &local_e0.super_TestCaseInfo.description.field_2) {
    operator_delete(local_e0.super_TestCaseInfo.description._M_dataplus._M_p,
                    local_e0.super_TestCaseInfo.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.super_TestCaseInfo.className._M_dataplus._M_p !=
      &local_e0.super_TestCaseInfo.className.field_2) {
    operator_delete(local_e0.super_TestCaseInfo.className._M_dataplus._M_p,
                    local_e0.super_TestCaseInfo.className.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.super_TestCaseInfo.name._M_dataplus._M_p !=
      &local_e0.super_TestCaseInfo.name.field_2) {
    operator_delete(local_e0.super_TestCaseInfo.name._M_dataplus._M_p,
                    local_e0.super_TestCaseInfo.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

AutoReg::AutoReg( ITestInvoker* invoker, SourceLineInfo const& lineInfo, StringRef const& classOrMethod, NameAndTags const& nameAndTags ) noexcept {
        CATCH_TRY {
            getMutableRegistryHub()
                    .registerTest(
                        makeTestCase(
                            invoker,
                            extractClassName( classOrMethod ),
                            nameAndTags,
                            lineInfo));
        }